

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ZSTD_DDict **ptr;
  ZSTD_DDict *ddict_00;
  ZSTD_customMem ZVar1;
  ZSTD_DDictHashSet *pZVar2;
  ZSTD_DDict **ppZVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (ddict == (ZSTD_DDict *)0x0) {
    return 0;
  }
  dctx->ddict = ddict;
  dctx->dictUses = ZSTD_use_indefinitely;
  if (dctx->refMultipleDDicts != ZSTD_rmd_refMultipleDDicts) {
    return 0;
  }
  if (dctx->ddictSet == (ZSTD_DDictHashSet *)0x0) {
    ZVar1 = dctx->customMem;
    pZVar2 = (ZSTD_DDictHashSet *)ZSTD_customMalloc(0x18,dctx->customMem);
    ppZVar3 = (ZSTD_DDict **)ZSTD_customCalloc(0x200,ZVar1);
    pZVar2->ddictPtrTable = ppZVar3;
    pZVar2->ddictPtrTableSize = 0x40;
    pZVar2->ddictPtrCount = 0;
    if (ppZVar3 == (ZSTD_DDict **)0x0) {
      pZVar2 = (ZSTD_DDictHashSet *)0x0;
    }
    dctx->ddictSet = pZVar2;
    if (ppZVar3 == (ZSTD_DDict **)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  pZVar2 = dctx->ddictSet;
  uVar4 = pZVar2->ddictPtrTableSize;
  if (uVar4 <= pZVar2->ddictPtrCount << 2) {
    ZVar1 = dctx->customMem;
    ppZVar3 = (ZSTD_DDict **)ZSTD_customCalloc(uVar4 << 4,dctx->customMem);
    if (ppZVar3 == (ZSTD_DDict **)0x0) {
      uVar4 = 0xffffffffffffffc0;
    }
    else {
      ptr = pZVar2->ddictPtrTable;
      sVar5 = pZVar2->ddictPtrTableSize;
      pZVar2->ddictPtrTable = ppZVar3;
      pZVar2->ddictPtrTableSize = uVar4 * 2;
      pZVar2->ddictPtrCount = 0;
      if (sVar5 != 0) {
        sVar6 = 0;
        do {
          ddict_00 = ptr[sVar6];
          if ((ddict_00 != (ZSTD_DDict *)0x0) &&
             (uVar4 = ZSTD_DDictHashSet_emplaceDDict(pZVar2,ddict_00), 0xffffffffffffff88 < uVar4))
          goto LAB_00234e59;
          sVar6 = sVar6 + 1;
        } while (sVar5 != sVar6);
      }
      ZSTD_customFree(ptr,ZVar1);
      uVar4 = 0;
    }
LAB_00234e59:
    if (0xffffffffffffff88 < uVar4) goto LAB_00234e75;
  }
  sVar5 = ZSTD_DDictHashSet_emplaceDDict(pZVar2,ddict);
  uVar4 = 0;
  if (0xffffffffffffff88 < sVar5) {
    uVar4 = sVar5;
  }
LAB_00234e75:
  if (uVar4 < 0xffffffffffffff89) {
    return 0;
  }
  return uVar4;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}